

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<duckdb::SQLIdentifier,duckdb::LogicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,SQLIdentifier *params,
          LogicalType *params_1)

{
  pointer pcVar1;
  LogicalType *in_R9;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_78;
  undefined1 local_58 [24];
  undefined1 local_40 [32];
  
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_40._0_8_ = (pointer)(local_40 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + msg->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_58,(LogicalType *)params);
  ConstructMessageRecursive<duckdb::SQLIdentifier,duckdb::LogicalType>
            (__return_storage_ptr__,this,&local_78,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_40,(SQLIdentifier *)local_58,in_R9);
  LogicalType::~LogicalType((LogicalType *)local_58);
  if ((pointer)local_40._0_8_ != (pointer)(local_40 + 0x10)) {
    operator_delete((void *)local_40._0_8_);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_78);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}